

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O3

pair<double,_double>
Function_Template::template_ProjectionProfile
          (ProjectionProfileForm2 ProjectionProfile,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  uint32_t i;
  uint uVar2;
  pair<double,_double> pVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> projection;
  TimerContainer timer;
  Image image;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  ImageTemplate<unsigned_char> local_80;
  Image local_58;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_58,size,size,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer((TimerContainer *)&local_80);
  uVar2 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start((TimerContainer *)&local_80);
    (*ProjectionProfile)(&local_58,false,&local_98);
    Performance_Test::TimerContainer::stop((TimerContainer *)&local_80);
    uVar2 = uVar2 + 1;
  }
  CleanupFunction(namespaceName);
  pVar3 = Performance_Test::BaseTimerContainer::mean((BaseTimerContainer *)&local_80);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)&local_80);
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  return pVar3;
}

Assistant:

std::pair < double, double > template_ProjectionProfile( ProjectionProfileForm2 ProjectionProfile , const std::string & namespaceName, uint32_t size )
    {
        const PenguinV_Image::Image image = Performance_Test::uniformImage( size, size );
        std::vector < uint32_t > projection;

        TEST_FUNCTION_LOOP( ProjectionProfile( image, false, projection ), namespaceName )
    }